

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

_Bool cf_h2_proxy_is_alive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  long *plVar1;
  undefined8 uVar2;
  _Bool local_39;
  cf_call_data save;
  CURLcode result;
  cf_h2_proxy_ctx *ctx;
  _Bool *input_pending_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  uVar2 = *(undefined8 *)((long)cf->ctx + 8);
  *(Curl_easy **)((long)cf->ctx + 8) = data;
  local_39 = false;
  if ((plVar1 != (long *)0x0) && (local_39 = false, *plVar1 != 0)) {
    local_39 = proxy_h2_connisalive(cf,data,input_pending);
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
      (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[0] conn alive -> %d, input_pending=%d",(ulong)(uint)local_39,
                      (ulong)(*input_pending & 1));
  }
  *(undefined8 *)((long)cf->ctx + 8) = uVar2;
  return local_39 != 0;
}

Assistant:

static bool cf_h2_proxy_is_alive(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 bool *input_pending)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result;
  struct cf_call_data save;

  CF_DATA_SAVE(save, cf, data);
  result = (ctx && ctx->h2 && proxy_h2_connisalive(cf, data, input_pending));
  CURL_TRC_CF(data, cf, "[0] conn alive -> %d, input_pending=%d",
              result, *input_pending);
  CF_DATA_RESTORE(cf, save);
  return result;
}